

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetWindowResizeBorderID(ImGuiWindow *window,ImGuiDir dir)

{
  ImGuiID IVar1;
  ImU32 local_24;
  bool local_1d;
  int local_18;
  ImGuiID id;
  int n;
  ImGuiDir dir_local;
  ImGuiWindow *window_local;
  
  local_1d = 3 < (uint)dir;
  id = dir;
  _n = window;
  if (local_1d) {
    __assert_fail("dir >= 0 && dir < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x16ef,"ImGuiID ImGui::GetWindowResizeBorderID(ImGuiWindow *, ImGuiDir)");
  }
  local_18 = dir + 4;
  if ((window->field_0x3f9 & 1) == 0) {
    local_24 = window->ID;
  }
  else {
    local_24 = window->DockNode->HostWindow->ID;
  }
  IVar1 = ImHashStr("#RESIZE",0,local_24);
  IVar1 = ImHashData(&local_18,4,IVar1);
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetWindowResizeBorderID(ImGuiWindow* window, ImGuiDir dir)
{
    IM_ASSERT(dir >= 0 && dir < 4);
    int n = (int)dir + 4;
    ImGuiID id = window->DockIsActive ? window->DockNode->HostWindow->ID : window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}